

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_collapse_rail.cpp
# Opt level: O2

void Omega_h::find_rails(Mesh *mesh,LOs *keys2verts,Read<long> *verts2rail,LOs *rails2edges,
                        Read<signed_char> *rail_col_dirs)

{
  char cVar1;
  int iVar2;
  Alloc *pAVar3;
  Write<signed_char> *this;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint size_in;
  size_t sVar8;
  Write<signed_char> rail_col_dirs_w;
  Write<int> rails2edges_w;
  string local_250;
  Write<int> local_230;
  Write<int> local_220;
  Write<int> local_210;
  Write<signed_char> local_200;
  Write<int> local_1f0;
  Write<signed_char> local_1e0;
  Write<signed_char> *local_1d0;
  Write<int> *local_1c8;
  Write<signed_char> local_1c0;
  Write<int> local_1b0;
  Read<long> edge_globals;
  Read<signed_char> ve_codes;
  LOs ve2e;
  LOs v2ve;
  Write<int> local_160;
  Write<int> local_150;
  Write<int> local_140;
  Write<int> local_130;
  Write<int> local_120;
  Write<signed_char> local_110;
  Write<int> local_100;
  Write<signed_char> local_f0;
  type f;
  Adj v2e;
  
  pAVar3 = (keys2verts->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar8 = pAVar3->size;
  }
  else {
    sVar8 = (ulong)pAVar3 >> 3;
  }
  local_1c8 = &rails2edges->write_;
  Mesh::ask_up(&v2e,mesh,0,1);
  Write<int>::Write(&v2ve.write_,(Write<int> *)&v2e);
  Write<int>::Write(&ve2e.write_,&v2e.super_Graph.ab2b.write_);
  Write<signed_char>::Write(&ve_codes.write_,&v2e.codes.write_);
  std::__cxx11::string::string((string *)&local_250,"",(allocator *)&local_160);
  size_in = (uint)(sVar8 >> 2);
  Write<int>::Write(&rails2edges_w,size_in,-1,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_250,"",(allocator *)&local_160);
  Write<signed_char>::Write(&rail_col_dirs_w,size_in,-1,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  Mesh::globals((Mesh *)&edge_globals,(Int)mesh);
  Write<int>::Write((Write<int> *)&f,&keys2verts->write_);
  Write<long>::Write((Write<int> *)&f.verts2rail,(Write<int> *)verts2rail);
  local_1d0 = &rail_col_dirs->write_;
  Write<int>::Write(&f.v2ve.write_,&v2ve.write_);
  Write<int>::Write(&f.ve2e.write_,&ve2e.write_);
  Write<long>::Write((Write<int> *)&f.edge_globals,(Write<int> *)&edge_globals);
  Write<signed_char>::Write(&f.ve_codes.write_,&ve_codes.write_);
  Write<int>::Write(&f.rails2edges_w,&rails2edges_w);
  Write<signed_char>::Write(&f.rail_col_dirs_w,&rail_col_dirs_w);
  Write<int>::Write(&local_160,(Write<int> *)&f);
  Write<long>::Write(&local_150,(Write<int> *)&f.verts2rail);
  Write<int>::Write(&local_140,&f.v2ve.write_);
  Write<int>::Write(&local_130,&f.ve2e.write_);
  Write<long>::Write(&local_120,(Write<int> *)&f.edge_globals);
  Write<signed_char>::Write(&local_110,&f.ve_codes.write_);
  Write<int>::Write(&local_100,&f.rails2edges_w);
  Write<signed_char>::Write(&local_f0,&f.rail_col_dirs_w);
  if (0 < (int)size_in) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_250,&local_160);
    Write<long>::Write((Write<int> *)&local_250.field_2,&local_150);
    Write<int>::Write(&local_230,&local_140);
    Write<int>::Write(&local_220,&local_130);
    Write<long>::Write(&local_210,&local_120);
    Write<signed_char>::Write(&local_200,&local_110);
    Write<int>::Write(&local_1f0,&local_100);
    Write<signed_char>::Write(&local_1e0,&local_f0);
    entering_parallel = 0;
    for (uVar5 = 0; uVar5 != (size_in & 0x7fffffff); uVar5 = uVar5 + 1) {
      lVar7 = (long)*(int *)(local_250._M_string_length + uVar5 * 4);
      lVar4 = (long)*(int *)((long)local_230.shared_alloc_.direct_ptr + lVar7 * 4);
      do {
        lVar6 = lVar4;
        if (*(int *)((long)local_230.shared_alloc_.direct_ptr + lVar7 * 4 + 4) <= lVar6) {
          fail("assertion %s failed at %s +%d\n","false",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_collapse_rail.cpp"
               ,0x67);
        }
        iVar2 = *(int *)((long)local_220.shared_alloc_.direct_ptr + lVar6 * 4);
        lVar4 = lVar6 + 1;
      } while (*(long *)((long)local_210.shared_alloc_.direct_ptr + (long)iVar2 * 8) !=
               *(long *)(local_250.field_2._8_8_ + lVar7 * 8));
      cVar1 = *(char *)((long)local_200.shared_alloc_.direct_ptr + lVar6);
      *(int *)((long)local_1f0.shared_alloc_.direct_ptr + uVar5 * 4) = iVar2;
      *(char *)((long)local_1e0.shared_alloc_.direct_ptr + uVar5) = cVar1 >> 3;
    }
    find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)
    ::$_0::~__0((__0 *)&local_250);
  }
  find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)
  ::$_0::~__0((__0 *)&local_160);
  Write<int>::Write(&local_1b0,&rails2edges_w);
  Read<int>::Read((Read<signed_char> *)&local_250,&local_1b0);
  this = local_1d0;
  Write<int>::operator=(local_1c8,(Write<int> *)&local_250);
  Write<int>::~Write((Write<int> *)&local_250);
  Write<int>::~Write(&local_1b0);
  Write<signed_char>::Write(&local_1c0,&rail_col_dirs_w);
  Read<signed_char>::Read((Read<signed_char> *)&local_250,&local_1c0);
  Write<signed_char>::operator=(this,(Write<signed_char> *)&local_250);
  Write<signed_char>::~Write((Write<signed_char> *)&local_250);
  Write<signed_char>::~Write(&local_1c0);
  find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)
  ::$_0::~__0((__0 *)&f);
  Write<long>::~Write(&edge_globals.write_);
  Write<signed_char>::~Write(&rail_col_dirs_w);
  Write<int>::~Write(&rails2edges_w);
  Write<signed_char>::~Write(&ve_codes.write_);
  Write<int>::~Write(&ve2e.write_);
  Write<int>::~Write(&v2ve.write_);
  Adj::~Adj(&v2e);
  return;
}

Assistant:

void find_rails(Mesh* mesh, LOs keys2verts, Read<GO> verts2rail,
    LOs* rails2edges, Read<I8>* rail_col_dirs) {
  auto nkeys = keys2verts.size();
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto v2ve = v2e.a2ab;
  auto ve2e = v2e.ab2b;
  auto ve_codes = v2e.codes;
  auto rails2edges_w = Write<LO>(nkeys, -1);
  auto rail_col_dirs_w = Write<I8>(nkeys, -1);
  auto edge_globals = mesh->globals(EDGE);
  auto f = OMEGA_H_LAMBDA(LO key) {
    auto v = keys2verts[key];
    auto rail_global = verts2rail[v];
    for (auto ve = v2ve[v]; ve < v2ve[v + 1]; ++ve) {
      auto e = ve2e[ve];
      auto edge_global = edge_globals[e];
      if (edge_global == rail_global) {
        auto ve_code = ve_codes[ve];
        auto eev = code_which_down(ve_code);
        rails2edges_w[key] = e;
        rail_col_dirs_w[key] = static_cast<I8>(eev);
        return;
      }
    }
    OMEGA_H_NORETURN();
  };
  parallel_for(nkeys, f, "find_rails");
  *rails2edges = rails2edges_w;
  *rail_col_dirs = rail_col_dirs_w;
}